

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Vec3fa __thiscall embree::Parms::getVec3fa(Parms *this,char *name,Vec3fa *def)

{
  Type TVar1;
  Type TVar2;
  bool bVar3;
  reference ppVar4;
  Type *in_RCX;
  char *in_RDX;
  Type *in_RDI;
  bool bVar5;
  Type TVar6;
  Type TVar7;
  ulong in_XMM1_Qa;
  Vec3fa VVar8;
  const_iterator i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
  *in_stack_fffffffffffffef8;
  Variant *this_00;
  undefined1 local_bc [43];
  allocator local_91;
  string local_90 [32];
  _Self local_70;
  Type *local_68;
  
  local_68 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,in_RDX,&local_91);
  local_70._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
       ::find(in_stack_fffffffffffffef8,(key_type *)0x3cf917);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_bc._12_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
       ::end(in_stack_fffffffffffffef8);
  bVar3 = std::operator==(&local_70,(_Self *)(local_bc + 0xc));
  bVar5 = true;
  if (!bVar3) {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>
                          *)0x3cf97a);
    bVar5 = (ppVar4->second).type != FLOAT3;
  }
  if (bVar5) {
    TVar6 = *local_68;
    TVar7 = local_68[1];
    TVar1 = local_68[2];
    TVar2 = local_68[3];
    *in_RDI = TVar6;
    in_RDI[1] = TVar7;
    in_RDI[2] = TVar1;
    in_RDI[3] = TVar2;
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>
                 *)0x3cfa0b);
    this_00 = (Variant *)local_bc;
    Variant::getVec3fa(this_00);
    TVar1 = (this_00->field_1).i[1];
    TVar6 = this_00->type;
    TVar7 = (this_00->field_1).i[0];
    in_XMM1_Qa = (ulong)TVar1;
    *in_RDI = TVar6;
    in_RDI[1] = TVar7;
    in_RDI[2] = TVar1;
    in_RDI[3] = EMPTY;
  }
  VVar8.field_0.m128[1] = (float)TVar7;
  VVar8.field_0.m128[0] = (float)TVar6;
  VVar8.field_0._8_8_ = in_XMM1_Qa;
  return (Vec3fa)VVar8.field_0;
}

Assistant:

Vec3fa getVec3fa(const char* name, const Vec3fa& def = zero) const {
      std::map<std::string,Variant>::const_iterator i = m.find(name);
      if (i == m.end() || (*i).second.type != Variant::FLOAT3) return def;
      return (*i).second.getVec3fa();
    }